

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global.util.c
# Opt level: O0

void pnga_print_patch_file2d
               (FILE *file,Integer g_a,Integer ilo,Integer ihi,Integer jlo,Integer jhi,
               Integer pretty)

{
  long lVar1;
  int iVar2;
  Integer IVar3;
  Integer *in_RCX;
  void *in_RDX;
  Integer *in_RSI;
  FILE *in_RDI;
  long in_R8;
  char *in_R9;
  Integer unaff_retaddr;
  long in_stack_00000008;
  char **in_stack_00000028;
  Integer in_stack_00000030;
  Integer *in_stack_00000038;
  Integer *in_stack_00000040;
  Integer *in_stack_00000048;
  Integer hi [2];
  Integer lo [2];
  Integer dims [2];
  Integer ndim;
  char *name;
  longlong llbuf [6];
  long lbuf [6];
  float fbuf [6];
  DoublePrecision dbuf [6];
  int ibuf [6];
  Integer a_grp;
  Integer bufsize;
  Integer ld;
  Integer jmax;
  Integer type;
  Integer dim2;
  Integer dim1;
  Integer jj;
  Integer j;
  Integer i;
  Integer in_stack_fffffffffffffe30;
  undefined4 uVar4;
  char *local_1a0;
  char *local_190;
  long local_168;
  long local_160;
  undefined8 local_150;
  undefined8 local_148 [6];
  undefined8 local_118 [6];
  float local_e8 [8];
  undefined8 local_c8 [6];
  uint local_98 [6];
  Integer local_80;
  long local_78;
  undefined8 local_70;
  char *local_68;
  long local_60;
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  Integer in_stack_ffffffffffffffc8;
  void *pvVar5;
  
  local_70 = 1;
  local_80 = pnga_get_pgroup((Integer)in_RSI);
  pnga_pgroup_sync(in_stack_fffffffffffffe30);
  pnga_check_handle(in_stack_00000030,(char *)in_stack_00000028);
  IVar3 = pnga_pgroup_nodeid(local_80);
  if (IVar3 == 0) {
    pnga_inquire(hi[0],in_stack_00000048,in_stack_00000040,in_stack_00000038);
    uVar4 = (undefined4)((ulong)in_stack_fffffffffffffe30 >> 0x20);
    local_50 = local_168;
    local_58 = local_160;
    pnga_inquire_name(in_stack_00000030,in_stack_00000028);
    if (((((long)in_RDX < 1) || (local_50 < (long)in_RCX)) || (in_R8 < 1)) ||
       (local_58 < (long)in_R9)) {
      fprintf(_stderr,"%ld %ld %ld %ld dims: [%ld,%ld]\n",in_RDX,in_RCX,in_R8,in_R9,local_50,
              local_58);
      uVar4 = (undefined4)((ulong)local_58 >> 0x20);
      pnga_error(in_R9,in_stack_ffffffffffffffc8);
    }
    in_stack_fffffffffffffe30 = CONCAT44(uVar4,(int)in_RSI);
    fprintf(in_RDI,"\n global array: %s[%ld:%ld,%ld:%ld],  handle: %d \n",local_150,in_RDX,in_RCX,
            in_R8,in_R9);
    iVar2 = 6;
    if (local_60 == 0x3ee) {
      iVar2 = 3;
    }
    local_78 = (long)iVar2;
    lVar1 = in_R8;
    pvVar5 = in_RDX;
    if (in_stack_00000008 == 0) {
      for (; lVar1 = in_R8, (long)in_RDX < (long)in_RCX + 1; in_RDX = (void *)((long)in_RDX + 1)) {
        while (local_40 = lVar1, local_40 < (long)(in_R9 + 1)) {
          local_190 = in_R9;
          if (local_40 + local_78 + -1 <= (long)in_R9) {
            local_190 = (char *)(local_40 + local_78 + -1);
          }
          local_68 = local_190;
          switch(local_60) {
          case 0x3e9:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8d",(ulong)local_98[local_48]);
            }
            break;
          case 0x3ea:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8ld",local_118[local_48]);
            }
            break;
          case 0x3eb:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %11.5f",(double)local_e8[local_48]);
            }
            break;
          case 0x3ec:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %11.5f",local_c8[local_48]);
            }
            break;
          default:
            pnga_error(in_R9,(Integer)in_RDX);
            break;
          case 0x3ee:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 2
                ) {
              fprintf(in_RDI," %11.5f,%11.5f",local_c8[local_48],local_c8[local_48 + 1]);
            }
            break;
          case 0x3ef:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 2
                ) {
              fprintf(in_RDI," %11.5f,%11.5f",local_c8[local_48],local_c8[local_48 + 1]);
            }
            break;
          case 0x3f8:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8lld",local_148[local_48]);
            }
          }
          lVar1 = local_78 + local_40;
        }
        fprintf(in_RDI,"\n");
      }
      fflush(in_RDI);
    }
    else {
      while (local_40 = lVar1, local_40 < (long)(in_R9 + 1)) {
        local_1a0 = in_R9;
        if (local_40 + local_78 + -1 <= (long)in_R9) {
          local_1a0 = (char *)(local_40 + local_78 + -1);
        }
        local_68 = local_1a0;
        fprintf(in_RDI,"\n");
        fprintf(in_RDI,"\n");
        fprintf(in_RDI,"      ");
        switch(local_60) {
        case 0x3e9:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%6ld  ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI," -------");
          }
          break;
        case 0x3ea:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%6ld  ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI," -------");
          }
          break;
        case 0x3ec:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%8ld    ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI," -----------");
          }
        case 0x3eb:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%8ld    ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI," -----------");
          }
          break;
        case 0x3ee:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%20ld    ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40;
              local_48 == (long)local_68 * 2 ||
              SBORROW8(local_48,(long)local_68 * 2) != local_48 + (long)local_68 * -2 < 0;
              local_48 = local_48 + 1) {
            fprintf(in_RDI," -----------");
          }
          break;
        case 0x3ef:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%20ld    ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40;
              local_48 == (long)local_68 * 2 ||
              SBORROW8(local_48,(long)local_68 * 2) != local_48 + (long)local_68 * -2 < 0;
              local_48 = local_48 + 1) {
            fprintf(in_RDI," -----------");
          }
          break;
        case 0x3f8:
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI,"%6ld  ",local_48);
          }
          fprintf(in_RDI,"\n      ");
          for (local_48 = local_40; local_48 <= (long)local_68; local_48 = local_48 + 1) {
            fprintf(in_RDI," -------");
          }
        }
        fprintf(in_RDI,"\n");
        pvVar5 = in_RDX;
        for (; (long)in_RDX < (long)in_RCX + 1; in_RDX = (void *)((long)in_RDX + 1)) {
          fprintf(in_RDI,"%4ld  ",in_RDX);
          switch(local_60) {
          case 0x3e9:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8d",(ulong)local_98[local_48]);
            }
            break;
          case 0x3ea:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8ld",local_118[local_48]);
            }
            break;
          case 0x3eb:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %11.5f",(double)local_e8[local_48]);
            }
            break;
          case 0x3ec:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %11.5f",local_c8[local_48]);
            }
            break;
          default:
            pnga_error(in_R9,(Integer)in_RDX);
            break;
          case 0x3ee:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 2
                ) {
              fprintf(in_RDI," %11.5f,%11.5f",local_c8[local_48],local_c8[local_48 + 1]);
            }
            break;
          case 0x3ef:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 2
                ) {
              fprintf(in_RDI," %11.5f,%11.5f",local_c8[local_48],local_c8[local_48 + 1]);
            }
            break;
          case 0x3f8:
            pnga_get(unaff_retaddr,(Integer *)in_RDI,in_RSI,pvVar5,in_RCX);
            for (local_48 = 0; local_48 < (long)(local_68 + (1 - local_40)); local_48 = local_48 + 1
                ) {
              fprintf(in_RDI," %8lld",local_148[local_48]);
            }
          }
          fprintf(in_RDI,"\n");
        }
        fflush(in_RDI);
        in_RDX = pvVar5;
        lVar1 = local_78 + local_40;
      }
    }
  }
  pnga_pgroup_sync(in_stack_fffffffffffffe30);
  return;
}

Assistant:

void pnga_print_patch_file2d(file, g_a, ilo, ihi, jlo, jhi, pretty)
        FILE *file;
        Integer g_a, ilo, ihi, jlo, jhi, pretty;
/*
  Pretty = 0 ... spew output out with no formatting
  Pretty = 1 ... format output so that it is readable
*/  
{
#define BUFSIZE 6
#define FLEN 80 
  Integer i, j,jj, dim1, dim2, type, jmax, ld=1, bufsize ;
  Integer a_grp;
  int ibuf[BUFSIZE];
  DoublePrecision  dbuf[BUFSIZE];
  float fbuf[BUFSIZE]; 
  long lbuf[BUFSIZE]; 
  long long llbuf[BUFSIZE]; 
  char *name;
  Integer ndim, dims[2];
  Integer lo[2], hi[2];

  a_grp = pnga_get_pgroup(g_a);
  pnga_pgroup_sync(a_grp);
  pnga_check_handle(g_a, "ga_print");
  if(pnga_pgroup_nodeid(a_grp) == 0){

    pnga_inquire(g_a, &type, &ndim, dims);
    dim1 = dims[0];
    dim2 = dims[1];
    /*     name[FLEN-1]='\0';*/
    pnga_inquire_name(g_a, &name);
    if (ilo <= 0 || ihi > dim1 || jlo <= 0 || jhi > dim2){
      fprintf(stderr,"%ld %ld %ld %ld dims: [%ld,%ld]\n", 
          (long)ilo,(long)ihi, (long)jlo,(long)jhi,
          (long)dim1, (long)dim2);
      pnga_error(" ga_print: indices out of range ", g_a);
    }

    fprintf(file,"\n global array: %s[%ld:%ld,%ld:%ld],  handle: %d \n",
        name, (long)ilo, (long)ihi, (long)jlo, (long)jhi, (int)g_a);

    bufsize = (type==C_DCPL)? BUFSIZE/2 : BUFSIZE;
    bufsize = (type==C_SCPL)? BUFSIZE/2 : BUFSIZE;


    if (!pretty) {
      for (i=ilo; i <ihi+1; i++){
        for (j=jlo; j <jhi+1; j+=bufsize){
          jmax = GA_MIN(j+bufsize-1,jhi);
          lo[0] = i;
          lo[1] = j;
          hi[0] = i;
          hi[1] = jmax;
          switch(type){
            case C_INT:
              pnga_get(g_a, lo, hi, ibuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8d",ibuf[jj]);
              break;
            case C_DBL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",dbuf[jj]);
              break;
            case C_DCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_SCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_FLOAT:
              pnga_get(g_a, lo, hi, fbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",fbuf[jj]);
              break;       
            case C_LONG:
              pnga_get(g_a, lo, hi, lbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8ld",lbuf[jj]);
              break;
            case C_LONGLONG:
              pnga_get(g_a, lo, hi, llbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8lld",llbuf[jj]);
              break;
            default: pnga_error("ga_print: wrong type",0);
          }
        }
        fprintf(file,"\n");
      }
      fflush(file);

    } else {

      for (j=jlo; j<jhi+1; j+=bufsize){
        jmax = GA_MIN(j+bufsize-1,jhi);

        fprintf(file, "\n"); fprintf(file, "\n");

        /* Print out column headers */

        fprintf(file, "      ");
        switch(type){
          case C_INT:
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_LONG:  
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_LONGLONG:  
            for (jj=j; jj<=jmax; jj++) fprintf(file, "%6ld  ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -------");
            break;
          case C_DCPL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%20ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=2*jmax; jj++) fprintf(file," -----------");
            break;
          case C_SCPL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%20ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=2*jmax; jj++) fprintf(file," -----------");
            break;
          case C_DBL:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%8ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -----------");         
          case C_FLOAT:
            for (jj=j; jj<=jmax; jj++) fprintf(file,"%8ld    ", (long)jj);
            fprintf(file,"\n      ");
            for (jj=j; jj<=jmax; jj++) fprintf(file," -----------");
        }
        fprintf(file,"\n");

        for(i=ilo; i <ihi+1; i++){
          fprintf(file,"%4ld  ",(long)i);

          lo[0] = i;
          lo[1] = i;
          hi[0] = j;
          hi[1] = jmax;
          switch(type){
            case C_INT:
              pnga_get(g_a, lo, hi, ibuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8d",ibuf[jj]);
              break;
            case C_LONG: 
              pnga_get(g_a, lo, hi, lbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8ld",lbuf[jj]);
              break;
            case C_LONGLONG: 
              pnga_get(g_a, lo, hi, llbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %8lld",llbuf[jj]);
              break;
            case C_DBL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",dbuf[jj]);
              break;
            case C_FLOAT:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj++)
                fprintf(file," %11.5f",fbuf[jj]);
              break;     
            case C_DCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            case C_SCPL:
              pnga_get(g_a, lo, hi, dbuf, &ld);
              for(jj=0; jj<(jmax-j+1); jj+=2)
                fprintf(file," %11.5f,%11.5f",dbuf[jj], dbuf[jj+1]);
              break;
            default: pnga_error("ga_print: wrong type",0);
          }
          fprintf(file,"\n");
        }
        fflush(file);
      }
    }
  }

  pnga_pgroup_sync(a_grp);
}